

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_40a165::Transaction::SetUp(Transaction *this)

{
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
  *this_00;
  TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)> *this_01;
  mock_database *this_02;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  MatcherBase<unsigned_long> local_f0;
  MatcherBase<pstore::address> local_d8;
  MatcherBase<bool> local_c0;
  MatcherBase<bool> local_a8;
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_90;
  
  this_02 = &this->db_;
  local_d8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::address>::
       GetVTable<testing::internal::MatcherBase<pstore::address>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0026b818;
  local_f0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_long>::
       GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0026b5f8;
  local_a8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<bool>::
       GetVTable<testing::internal::MatcherBase<bool>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0026b778;
  local_c0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<bool>::
       GetVTable<testing::internal::MatcherBase<bool>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_c0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0026b778;
  mock_database::gmock_get
            (&local_90,this_02,(Matcher<pstore::address> *)&local_d8,
             (Matcher<unsigned_long> *)&local_f0,(Matcher<bool> *)&local_a8,
             (Matcher<bool> *)&local_c0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            InternalExpectedAt(&local_90,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,0x61,"db_","get (_, _, _, _)");
  local_110._M_unused._M_object = operator_new(0x18);
  *(mock_database **)local_110._M_unused._0_8_ = this_02;
  *(code **)((long)local_110._M_unused._0_8_ + 8) = mock_database::base_get;
  *(long *)((long)local_110._M_unused._0_8_ + 0x10) = 0;
  local_110._8_8_ = 0;
  local_100 = std::
              _Function_handler<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>_>
              ::_M_manager;
  local_f8 = std::
             _Function_handler<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>_>
             ::_M_invoke;
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillRepeatedly(this_00,(Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
                          *)&local_110);
  if (local_100 != (code *)0x0) {
    (*local_100)(&local_110,&local_110,__destroy_functor);
  }
  testing::internal::MatcherBase<pstore::address>::~MatcherBase
            ((MatcherBase<pstore::address> *)
             &local_90.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Head_base<0UL,_testing::Matcher<pstore::address>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_90.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<bool>::~MatcherBase
            ((MatcherBase<bool> *)
             &local_90.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Tuple_impl<2UL,_testing::Matcher<bool>,_testing::Matcher<bool>_>.
              super__Head_base<2UL,_testing::Matcher<bool>,_false>);
  testing::internal::MatcherBase<bool>::~MatcherBase((MatcherBase<bool> *)&local_90.matchers_);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_c0);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_a8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_f0);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase(&local_d8);
  local_d8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_long>::
       GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0026b5f8;
  local_f0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_int>::
       GetVTable<testing::internal::MatcherBase<unsigned_int>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0026b698;
  mock_database::gmock_allocate
            ((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)&local_90,this_02,
             (Matcher<unsigned_long> *)&local_d8,(Matcher<unsigned_int> *)&local_f0);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::
            InternalExpectedAt((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)&local_90,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,99,"db_","allocate (_, _)");
  local_110._M_unused._M_object = operator_new(0x18);
  *(mock_database **)local_110._M_unused._0_8_ = this_02;
  *(code **)((long)local_110._M_unused._0_8_ + 8) = mock_database::base_allocate;
  *(long *)((long)local_110._M_unused._0_8_ + 0x10) = 0;
  local_110._8_8_ = 0;
  local_100 = std::
              _Function_handler<pstore::address_(unsigned_long,_unsigned_int),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>_>
              ::_M_manager;
  local_f8 = std::
             _Function_handler<pstore::address_(unsigned_long,_unsigned_int),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>_>
             ::_M_invoke;
  testing::internal::TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)>::WillRepeatedly
            (this_01,(Action<pstore::address_(unsigned_long,_unsigned_int)> *)&local_110);
  if (local_100 != (code *)0x0) {
    (*local_100)(&local_110,&local_110,__destroy_functor);
  }
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_90.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Tuple_impl<2UL,_testing::Matcher<bool>,_testing::Matcher<bool>_>.
              super__Head_base<2UL,_testing::Matcher<bool>,_false>);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_90.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)&local_f0)
  ;
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_d8);
  return;
}

Assistant:

void Transaction::SetUp () {
        using ::testing::_;
        using ::testing::Invoke;

        // Pass the mocked calls through to their original implementations.
        // I'm simply using the mocking framework to observe that the
        // correct calls are made. The precise division of labor between
        // the database and transaction classes is enforced or determined here.
        EXPECT_CALL (db_, get (_, _, _, _))
            .WillRepeatedly (Invoke (&db_, &mock_database::base_get));
        EXPECT_CALL (db_, allocate (_, _))
            .WillRepeatedly (Invoke (&db_, &mock_database::base_allocate));
    }